

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O2

void __thiscall
btStridingMeshInterface::InternalProcessAllTriangles
          (btStridingMeshInterface *this,btInternalTriangleIndexCallback *callback,
          btVector3 *aabbMin,btVector3 *aabbMax)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  btScalar bVar7;
  int numtriangles;
  int stride;
  int indexstride;
  undefined8 local_98;
  float local_90;
  undefined4 local_8c;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined8 local_78;
  float local_70;
  undefined4 local_6c;
  uchar *indexbase;
  uchar *vertexbase;
  PHY_ScalarType gfxindextype;
  PHY_ScalarType type;
  undefined8 local_48;
  undefined8 uStack_40;
  int numverts;
  
  iVar1 = (*this->_vptr_btStridingMeshInterface[7])();
  local_48 = *(undefined8 *)(this->m_scaling).m_floats;
  uStack_40 = 0;
  bVar7 = (this->m_scaling).m_floats[2];
  uVar6 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; (int)uVar6 != iVar1; uVar6 = (ulong)((int)uVar6 + 1)) {
    (*this->_vptr_btStridingMeshInterface[4])
              (this,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,&numtriangles,
               &gfxindextype,uVar6,bVar7);
    if (type == PHY_DOUBLE) {
      if (gfxindextype == PHY_INTEGER) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          local_90 = (float)*(double *)
                             (vertexbase +
                             (ulong)(uint)(*(int *)(indexbase + lVar2) * stride) + 0x10) * bVar7;
          local_98 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (uint)(*(int *)(indexbase + lVar2) * stride)) + 8) *
                              local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase + (uint)(*(int *)(indexbase + lVar2) * stride)) *
                              (float)local_48);
          local_8c = 0;
          local_80 = (float)*(double *)
                             (vertexbase +
                             (ulong)(uint)(*(int *)(indexbase + lVar2 + 4) * stride) + 0x10) * bVar7
          ;
          local_88 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (uint)(*(int *)(indexbase + lVar2 + 4) * stride)) + 8)
                              * local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase + (uint)(*(int *)(indexbase + lVar2 + 4) * stride)
                                      ) * (float)local_48);
          local_7c = 0;
          local_70 = (float)*(double *)
                             (vertexbase +
                             (ulong)(uint)(stride * *(int *)(indexbase + lVar2 + 8)) + 0x10) * bVar7
          ;
          local_78 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (uint)(stride * *(int *)(indexbase + lVar2 + 8))) + 8)
                              * local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase + (uint)(stride * *(int *)(indexbase + lVar2 + 8))
                                      ) * (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
      else if (gfxindextype == PHY_SHORT) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          lVar3 = (long)stride;
          local_90 = (float)*(double *)
                             (vertexbase + (ulong)*(ushort *)(indexbase + lVar2) * lVar3 + 0x10) *
                     bVar7;
          local_98 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (ulong)*(ushort *)(indexbase + lVar2) * lVar3) + 8) *
                              local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase + (ulong)*(ushort *)(indexbase + lVar2) * lVar3) *
                              (float)local_48);
          local_8c = 0;
          local_80 = (float)*(double *)
                             (vertexbase + (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3 + 0x10)
                     * bVar7;
          local_88 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3) + 8)
                              * local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase +
                                      (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3) *
                              (float)local_48);
          local_7c = 0;
          local_70 = (float)*(double *)
                             (vertexbase + (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3 + 0x10)
                     * bVar7;
          local_78 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase +
                                             (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3) + 8)
                              * local_48._4_4_,
                              (float)*(double *)
                                      (vertexbase +
                                      (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3) *
                              (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
      else if (gfxindextype == PHY_UCHAR) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          lVar3 = (long)stride;
          local_90 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar2] * lVar3 + 0x10) * bVar7
          ;
          local_98 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase + (ulong)indexbase[lVar2] * lVar3) + 8) *
                              local_48._4_4_,
                              (float)*(double *)(vertexbase + (ulong)indexbase[lVar2] * lVar3) *
                              (float)local_48);
          local_8c = 0;
          local_80 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3 + 0x10) *
                     bVar7;
          local_88 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3) + 8)
                              * local_48._4_4_,
                              (float)*(double *)(vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3) *
                              (float)local_48);
          local_7c = 0;
          local_70 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3 + 0x10) *
                     bVar7;
          local_78 = CONCAT44((float)*(double *)
                                      ((long)(vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3) + 8)
                              * local_48._4_4_,
                              (float)*(double *)(vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3) *
                              (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
    }
    else if (type == PHY_FLOAT) {
      if (gfxindextype == PHY_INTEGER) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          local_90 = *(float *)(vertexbase + (ulong)(uint)(*(int *)(indexbase + lVar2) * stride) + 8
                               ) * bVar7;
          local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (uint)(*(int *)(indexbase + lVar2) * stride)) >> 0x20)
                              * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (uint)(*(int *)(indexbase + lVar2) * stride)) *
                              (float)local_48);
          local_8c = 0;
          local_80 = *(float *)(vertexbase +
                               (ulong)(uint)(*(int *)(indexbase + lVar2 + 4) * stride) + 8) * bVar7;
          local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (uint)(*(int *)(indexbase + lVar2 + 4) * stride)) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (uint)(*(int *)(indexbase + lVar2 + 4) * stride)
                                      ) * (float)local_48);
          local_7c = 0;
          local_70 = *(float *)(vertexbase +
                               (ulong)(uint)(stride * *(int *)(indexbase + lVar2 + 8)) + 8) * bVar7;
          local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (uint)(stride * *(int *)(indexbase + lVar2 + 8))) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (uint)(stride * *(int *)(indexbase + lVar2 + 8))
                                      ) * (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
      else if (gfxindextype == PHY_SHORT) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          lVar3 = (long)stride;
          local_90 = *(float *)(vertexbase + (ulong)*(ushort *)(indexbase + lVar2) * lVar3 + 8) *
                     bVar7;
          local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (ulong)*(ushort *)(indexbase + lVar2) * lVar3) >> 0x20
                                     ) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (ulong)*(ushort *)(indexbase + lVar2) * lVar3) *
                              (float)local_48);
          local_8c = 0;
          local_80 = *(float *)(vertexbase + (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3 + 8)
                     * bVar7;
          local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase +
                                      (ulong)*(ushort *)(indexbase + lVar2 + 2) * lVar3) *
                              (float)local_48);
          local_7c = 0;
          local_70 = *(float *)(vertexbase + (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3 + 8)
                     * bVar7;
          local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase +
                                              (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase +
                                      (ulong)*(ushort *)(indexbase + lVar2 + 4) * lVar3) *
                              (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
      else if (gfxindextype == PHY_UCHAR) {
        uVar5 = 0;
        while (iVar4 = (int)uVar5, iVar4 < numtriangles) {
          lVar2 = (long)iVar4 * (long)indexstride;
          lVar3 = (long)stride;
          local_90 = *(float *)(vertexbase + (ulong)indexbase[lVar2] * lVar3 + 8) * bVar7;
          local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase + (ulong)indexbase[lVar2] * lVar3) >> 0x20
                                     ) * local_48._4_4_,
                              (float)*(undefined8 *)(vertexbase + (ulong)indexbase[lVar2] * lVar3) *
                              (float)local_48);
          local_8c = 0;
          local_80 = *(float *)(vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3 + 8) * bVar7;
          local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (ulong)indexbase[lVar2 + 1] * lVar3) *
                              (float)local_48);
          local_7c = 0;
          local_70 = *(float *)(vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3 + 8) * bVar7;
          local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                              (vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3) >>
                                     0x20) * local_48._4_4_,
                              (float)*(undefined8 *)
                                      (vertexbase + (ulong)indexbase[lVar2 + 2] * lVar3) *
                              (float)local_48);
          local_6c = 0;
          (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar6,uVar5);
          uVar5 = (ulong)(iVar4 + 1);
        }
      }
    }
    (*this->_vptr_btStridingMeshInterface[6])(this,uVar6);
  }
  return;
}

Assistant:

void	btStridingMeshInterface::InternalProcessAllTriangles(btInternalTriangleIndexCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	(void)aabbMin;
	(void)aabbMax;
	int numtotalphysicsverts = 0;
	int part,graphicssubparts = getNumSubParts();
	const unsigned char * vertexbase;
	const unsigned char * indexbase;
	int indexstride;
	PHY_ScalarType type;
	PHY_ScalarType gfxindextype;
	int stride,numverts,numtriangles;
	int gfxindex;
	btVector3 triangle[3];

	btVector3 meshScaling = getScaling();

	///if the number of parts is big, the performance might drop due to the innerloop switch on indextype
	for (part=0;part<graphicssubparts ;part++)
	{
		getLockedReadOnlyVertexIndexBase(&vertexbase,numverts,type,stride,&indexbase,indexstride,numtriangles,gfxindextype,part);
		numtotalphysicsverts+=numtriangles*3; //upper bound

		///unlike that developers want to pass in double-precision meshes in single-precision Bullet build
		///so disable this feature by default
		///see patch http://code.google.com/p/bullet/issues/detail?id=213

		switch (type)
		{
		case PHY_FLOAT:
		 {

			 float* graphicsbase;

			 switch (gfxindextype)
			 {
			 case PHY_INTEGER:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 case PHY_SHORT:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			case PHY_UCHAR:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 default:
				 btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
			 }
			 break;
		 }

		case PHY_DOUBLE:
			{
				double* graphicsbase;

				switch (gfxindextype)
				{
				case PHY_INTEGER:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_SHORT:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_UCHAR:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				default:
					btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
				}
				break;
			}
		default:
			btAssert((type == PHY_FLOAT) || (type == PHY_DOUBLE));
		}

		unLockReadOnlyVertexBase(part);
	}
}